

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O3

void __thiscall
Hydro::MacProjector::updateBeta
          (MacProjector *this,
          Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
          *a_beta)

{
  pointer paVar1;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->m_linop == (MLLinOp *)0x0) {
    amrex::Assert_host("m_linop != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                       ,0x90,
                       "\"MacProjector::updateBeta: initProjector must be called before calling this method\""
                      );
  }
  if ((this->m_poisson)._M_t.
      super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
      super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
    amrex::Assert_host("m_poisson == nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                       ,0x94,"\"MacProjector::updateBeta: should not be called for constant beta\"")
    ;
  }
  paVar1 = (a_beta->
           super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
           ).
           super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(a_beta->
                      super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                      ).
                      super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 3) * -0x55555555;
  _Var2._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         *)&((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              *)((long)&paVar1->_M_elems[0]->super_FabArray<amrex::FArrayBox> + 0xf0))->_M_t;
  if (((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        )_Var2._M_t.
         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        )0x0) ||
     (lVar3 = __dynamic_cast(_Var2._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0), lVar3 == 0)) {
    if (0 < (int)uVar4) {
      lVar3 = 0;
      uVar5 = 0;
      do {
        amrex::MLABecLaplacian::setBCoeffs
                  ((this->m_abeclap)._M_t.
                   super___uniq_ptr_impl<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::MLABecLaplacian_*,_std::default_delete<amrex::MLABecLaplacian>_>
                   .super__Head_base<0UL,_amrex::MLABecLaplacian_*,_false>._M_head_impl,(int)uVar5,
                   (Array<const_MultiFab_*,_3> *)
                   ((long)((a_beta->
                           super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                           ).
                           super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar3));
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x18;
      } while ((uVar4 & 0x7fffffff) != uVar5);
    }
  }
  else if (0 < (int)uVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      amrex::MLEBABecLap::setBCoeffs
                ((this->m_eb_abeclap)._M_t.
                 super___uniq_ptr_impl<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::MLEBABecLap_*,_std::default_delete<amrex::MLEBABecLap>_>
                 .super__Head_base<0UL,_amrex::MLEBABecLap_*,_false>._M_head_impl,(int)uVar5,
                 (Array<const_MultiFab_*,_3> *)
                 ((long)((a_beta->
                         super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                         ).
                         super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar3),
                 this->m_beta_loc);
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x18;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  return;
}

Assistant:

void MacProjector::updateBeta (
    const Vector<Array<MultiFab const*, AMREX_SPACEDIM>>& a_beta)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_linop != nullptr,
        "MacProjector::updateBeta: initProjector must be called before calling this method");

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_poisson == nullptr,
        "MacProjector::updateBeta: should not be called for constant beta");

    const int nlevs = a_beta.size();
#ifdef AMREX_USE_EB
    const bool has_eb = a_beta[0][0]->hasEBFabFactory();
    if (has_eb) {
        for (int ilev=0; ilev < nlevs; ++ilev)
            m_eb_abeclap->setBCoeffs(ilev, a_beta[ilev], m_beta_loc);
    } else
#endif
    {
        for (int ilev=0; ilev < nlevs; ++ilev)
            m_abeclap->setBCoeffs(ilev, a_beta[ilev]);
    }
}